

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.h
# Opt level: O0

void __thiscall
Logger<(Log)0>::createMessage<unsigned_long&,unsigned_long&>
          (Logger<(Log)0> *this,stringstream *msg,char *fmt,unsigned_long *arg,unsigned_long *args)

{
  ulong *in_RCX;
  char *in_RDX;
  long in_RSI;
  stringstream *in_RDI;
  bool doSkipNext;
  unsigned_long *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  byte bVar1;
  undefined7 in_stack_ffffffffffffffd0;
  byte bVar2;
  char *local_18;
  
  bVar2 = 0;
  local_18 = in_RDX;
  while( true ) {
    bVar1 = 0;
    if (*local_18 != '%') {
      bVar1 = bVar2 ^ 0xff;
    }
    if ((bVar1 & 1) == 0) break;
    bVar2 = 0;
    if (*local_18 == '\0') {
      return;
    }
    if (*local_18 == '\\') {
      bVar2 = 1;
    }
    else {
      std::operator<<((ostream *)(in_RSI + 0x10),*local_18);
      local_18 = local_18 + 1;
    }
  }
  std::ostream::operator<<((void *)(in_RSI + 0x10),*in_RCX);
  createMessage<unsigned_long&>
            ((Logger<(Log)0> *)CONCAT17(bVar2,in_stack_ffffffffffffffd0),in_RDI,
             (char *)CONCAT17(bVar1,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8);
  return;
}

Assistant:

void createMessage(std::stringstream& msg, const char* fmt, 
                                                  Arg1&& arg, Args&&... args)
     {
       bool doSkipNext = false;
       while (*fmt != '%' && !doSkipNext)
       {
         doSkipNext = false;
         //Make sure we're not running past the end of our formatting string.
         if (*fmt == '\0')
           return;
           
         if (*fmt == '\\')
         { //Escape for the %sign
           doSkipNext = true;
         }
         else
         {
           msg << *fmt;
           fmt++;
         }
       }

       fmt++; //Consume the % sign
       msg << arg;
       createMessage(msg, fmt, args...); //and recursively call ourselve / the method below.
     }